

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  pointer pcVar1;
  ostream *this_00;
  char cVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if ((this->m_str)._M_string_length <= uVar4) {
      return;
    }
    pcVar1 = (this->m_str)._M_dataplus._M_p;
    cVar2 = pcVar1[uVar4];
    if (cVar2 == '\"') {
      if (this->m_forWhat != ForAttributes) {
        cVar2 = '\"';
        goto LAB_001607f1;
      }
      pcVar3 = "&quot;";
LAB_00160783:
      std::operator<<(os,pcVar3);
    }
    else {
      if (cVar2 == '&') {
        pcVar3 = "&amp;";
        goto LAB_00160783;
      }
      if (cVar2 == '>') {
        if (((2 < uVar4) && (pcVar1[uVar4 - 1] == ']')) && (pcVar1[uVar4 - 2] == ']')) {
          pcVar3 = "&gt;";
          goto LAB_00160783;
        }
        cVar2 = '>';
LAB_001607f1:
        std::operator<<(os,cVar2);
      }
      else {
        if (cVar2 == '<') {
          pcVar3 = "&lt;";
          goto LAB_00160783;
        }
        if (('\b' < cVar2) && (cVar2 != '\x7f' && 0x11 < (byte)(cVar2 - 0xeU))) goto LAB_001607f1;
        this_00 = std::operator<<(os,"&#x");
        *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
             *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) | 0x4000;
        *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
             *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(this_00,(int)cVar2);
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << static_cast<int>( c );
                        else
                            os << c;
                }
            }
        }